

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O0

Tone * Tunings::toneFromString(Tone *__return_storage_ptr__,string *fullLine,int lineno)

{
  long lVar1;
  char *pcVar2;
  longlong lVar3;
  TuningError *this;
  double dVar4;
  double dVar5;
  string local_180 [32];
  string local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  __cxx11 local_120 [32];
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [39];
  allocator local_b9;
  string local_b8 [8];
  string s;
  string local_98 [32];
  string local_78 [32];
  long local_58;
  size_type slashPos;
  string line;
  int lineno_local;
  string *fullLine_local;
  Tone *t;
  
  Tone::Tone(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->stringRep,(string *)fullLine);
  __return_storage_ptr__->lineno = lineno;
  std::__cxx11::string::find((char *)fullLine,0x10d235);
  std::__cxx11::string::substr((ulong)&slashPos,(ulong)fullLine);
  lVar1 = std::__cxx11::string::find((char)&slashPos,0x2e);
  if (lVar1 == -1) {
    __return_storage_ptr__->type = kToneRatio;
    local_58 = std::__cxx11::string::find((char)&slashPos,0x2f);
    if (local_58 == -1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = atoll(pcVar2);
      __return_storage_ptr__->ratio_n = lVar3;
      __return_storage_ptr__->ratio_d = 1;
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)&slashPos);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = atoll(pcVar2);
      __return_storage_ptr__->ratio_n = lVar3;
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::substr((ulong)local_98,(ulong)&slashPos);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = atoll(pcVar2);
      __return_storage_ptr__->ratio_d = lVar3;
      std::__cxx11::string::~string(local_98);
    }
    if ((__return_storage_ptr__->ratio_n == 0) || (__return_storage_ptr__->ratio_d == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Invalid tone in SCL file.",&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      if (-1 < lineno) {
        std::__cxx11::to_string(local_120,lineno);
        std::operator+((char *)local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Line ")
        ;
        std::operator+(local_e0,(char *)local_100);
        std::__cxx11::string::operator+=(local_b8,(string *)local_e0);
        std::__cxx11::string::~string((string *)local_e0);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string((string *)local_120);
      }
      std::operator+((char *)local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     " Line is \'");
      std::operator+(local_140,(char *)local_160);
      std::__cxx11::string::operator+=(local_b8,(string *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string(local_160);
      this = (TuningError *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string(local_180,local_b8);
      TuningError::TuningError(this,(string *)local_180);
      __cxa_throw(this,&TuningError::typeinfo,TuningError::~TuningError);
    }
    dVar4 = log(((double)__return_storage_ptr__->ratio_n * 1.0) /
                (double)__return_storage_ptr__->ratio_d);
    dVar5 = log(2.0);
    __return_storage_ptr__->cents = (dVar4 * 1200.0) / dVar5;
  }
  else {
    __return_storage_ptr__->type = kToneCents;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    dVar4 = locale_atof(pcVar2);
    __return_storage_ptr__->cents = dVar4;
  }
  __return_storage_ptr__->floatValue = __return_storage_ptr__->cents / 1200.0 + 1.0;
  std::__cxx11::string::~string((string *)&slashPos);
  return __return_storage_ptr__;
}

Assistant:

inline Tone toneFromString(const std::string &fullLine, int lineno)
{
    Tone t;
    t.stringRep = fullLine;
    t.lineno = lineno;

    // Allow end-of-line comments, e.g. "555/524 ! c# 138.75 Hz"
    std::string line = fullLine.substr(0, fullLine.find("!", 0));

    if (line.find('.') != std::string::npos)
    {
        t.type = Tone::kToneCents;
        t.cents = locale_atof(line.c_str());
    }
    else
    {
        t.type = Tone::kToneRatio;
        auto slashPos = line.find('/');
        if (slashPos == std::string::npos)
        {
            t.ratio_n = atoll(line.c_str());
            t.ratio_d = 1;
        }
        else
        {
            t.ratio_n = atoll(line.substr(0, slashPos).c_str());
            t.ratio_d = atoll(line.substr(slashPos + 1).c_str());
        }

        if (t.ratio_n == 0 || t.ratio_d == 0)
        {
            std::string s = "Invalid tone in SCL file.";
            if (lineno >= 0)
                s += "Line " + std::to_string(lineno) + ".";
            s += " Line is '" + line + "'.";
            throw TuningError(s);
        }
        // 2^(cents/1200) = n/d
        // cents = 1200 * log(n/d) / log(2)

        t.cents = 1200 * log(1.0 * t.ratio_n / t.ratio_d) / log(2.0);
    }
    t.floatValue = t.cents / 1200.0 + 1.0;
    return t;
}